

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

void objutadv(objucxdef *undoctx)

{
  ushort uVar1;
  short sVar2;
  ushort uVar3;
  
  if (undoctx->objucxtail == undoctx->objucxprv) {
    undoctx->objucxhead = 0;
    undoctx->objucxtail = 0;
    undoctx->objucxprv = 0;
    undoctx->objucxtop = 0;
  }
  uVar1 = undoctx->objucxtail;
  if (uVar1 == undoctx->objucxtop) {
    uVar3 = 0;
  }
  else {
    sVar2 = 3;
    switch(undoctx->objucxbuf[uVar1]) {
    case '\x01':
    case '\x04':
      sVar2 = 7;
      break;
    case '\x02':
      sVar2 = *(short *)(undoctx[1].objucxbuf + ((ulong)uVar1 - 0x36)) + 0xd;
      break;
    case '\x05':
      uVar3 = (*undoctx->objucxcsz)(undoctx->objucxccx,undoctx->objucxbuf + (ulong)uVar1 + 3);
      sVar2 = uVar3 + 3;
    }
    uVar3 = sVar2 + undoctx->objucxtail;
  }
  undoctx->objucxtail = uVar3;
  return;
}

Assistant:

void objutadv(objucxdef *undoctx)
{
    uchar  *p;
    ushort  siz;
    uchar   pr[PRPHDRSIZ];                   /* space for a property header */
    uchar   cmd;
    
    /* if we're at the most recently written record, flush buffer */
    if (undoctx->objucxtail == undoctx->objucxprv)
    {
        undoctx->objucxtail = 0;
        undoctx->objucxprv = 0;
        undoctx->objucxhead = 0;
        undoctx->objucxtop = 0;
    }

    /* if we've reached high water mark, wrap back to bottom */
    if (undoctx->objucxtail == undoctx->objucxtop)
    {
        undoctx->objucxtail = 0;
        return;
    }
    
    /* determine size by inspecting current record */
    p = undoctx->objucxbuf + undoctx->objucxtail;
    siz = 1 + sizeof(ushort);                          /* basic header size */
    
    cmd = *p++;
    p += sizeof(ushort);                       /* skip the previous pointer */
    
    switch(cmd)
    {
    case OBJUCHG:
        /* change:  property header (added below) plus data value */
        memcpy(pr, p + sizeof(mcmon) + sizeof(prpnum), (size_t)PRPHDRSIZ);
        siz += PRPHDRSIZ + prpsize(pr);
        /* FALLTHROUGH */

    case OBJUADD:
    case OBJUOVR:
        /* add/override:  property header only */
        siz += sizeof(mcmon) + sizeof(prpnum);
        break;
        
    case OBJUCLI:
        siz += (*undoctx->objucxcsz)(undoctx->objucxccx, p);
        break;

    case OBJUSAV:
        break;
    }
    
    undoctx->objucxtail += siz;
}